

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O0

void __thiscall BoardView::FlipBoard(BoardView *this,int mode)

{
  int in_ESI;
  BoardView *in_RDI;
  ImGuiIO io;
  ImVec2 bpos;
  ImVec2 view;
  ImVec2 mpos;
  ImGuiIO *in_stack_ffffffffffffc6d0;
  float in_stack_ffffffffffffc6d8;
  float in_stack_ffffffffffffc6dc;
  float in_stack_ffffffffffffc6e0;
  float in_stack_ffffffffffffc6e4;
  int in_stack_ffffffffffffc6e8;
  int in_stack_ffffffffffffc6ec;
  BoardView *in_stack_ffffffffffffc6f0;
  byte local_37fb;
  uint local_c;
  
  ImGui::GetMousePos();
  ScreenToCoord((BoardView *)CONCAT44(in_stack_ffffffffffffc6ec,in_stack_ffffffffffffc6e8),
                in_stack_ffffffffffffc6e4,in_stack_ffffffffffffc6e0,in_stack_ffffffffffffc6dc);
  ImGui::GetIO();
  ImGuiIO::ImGuiIO(in_stack_ffffffffffffc6d0,(ImGuiIO *)in_RDI);
  if (in_ESI == 1) {
    local_c = 0;
  }
  else {
    local_c = (in_RDI->config).flipMode;
  }
  in_RDI->m_current_side = in_RDI->m_current_side ^ 1;
  in_RDI->m_dx = -in_RDI->m_dx;
  if (((in_RDI->m_flipVertically & 1U) != 0) && (Rotate(in_RDI,2), (local_37fb & 1) != local_c)) {
    SetTarget((BoardView *)CONCAT44(in_stack_ffffffffffffc6e4,in_stack_ffffffffffffc6e0),
              in_stack_ffffffffffffc6dc,in_stack_ffffffffffffc6d8);
    Pan(in_stack_ffffffffffffc6f0,in_stack_ffffffffffffc6ec,in_stack_ffffffffffffc6e8);
    Pan(in_stack_ffffffffffffc6f0,in_stack_ffffffffffffc6ec,in_stack_ffffffffffffc6e8);
  }
  in_RDI->m_needsRedraw = true;
  ImGuiIO::~ImGuiIO((ImGuiIO *)0x1211d9);
  return;
}

Assistant:

void BoardView::FlipBoard(int mode) {
	ImVec2 mpos = ImGui::GetMousePos();
	// ImVec2 view = ImGui::GetIO().DisplaySize;
	ImVec2 view = m_board_surface;
	ImVec2 bpos = ScreenToCoord(mpos.x, mpos.y);
	auto io     = ImGui::GetIO();

	if (mode == 1)
		mode = 0;
	else
		mode = config.flipMode;

	m_current_side ^= 1;
	m_dx = -m_dx;
	if (m_flipVertically) {
		Rotate(2);
		if (io.KeyShift ^ mode) {
			SetTarget(bpos.x, bpos.y);
			Pan(DIR_RIGHT, view.x / 2 - mpos.x);
			Pan(DIR_DOWN, view.y / 2 - mpos.y);
		}
	}
	m_needsRedraw = true;
}